

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMin(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,int start,int incr)

{
  int iVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  bool bVar8;
  type_conflict5 tVar9;
  Status SVar10;
  double *pdVar11;
  long lVar12;
  pointer pnVar13;
  pointer pnVar14;
  pointer pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint uVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  Real local_f10;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f08;
  cpp_dec_float<200U,_int,_void> *local_f00;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ef8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ef0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ee8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ee0;
  Real local_ed8;
  pointer local_ed0;
  cpp_dec_float<200U,_int,_void> *local_ec8;
  Random *local_ec0;
  cpp_dec_float<200U,_int,_void> local_eb8;
  cpp_dec_float<200U,_int,_void> local_e38;
  cpp_dec_float<200U,_int,_void> local_db8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar20 = 0;
  local_ed0 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0x40240000;
  minrandom.m_backend.fpclass = cpp_dec_float_finite;
  minrandom.m_backend.prec_elem = 0x1c;
  minrandom.m_backend.data._M_elems[0] = 0;
  minrandom.m_backend.data._M_elems[1] = 0;
  minrandom.m_backend.data._M_elems[2] = 0;
  minrandom.m_backend.data._M_elems[3] = 0;
  minrandom.m_backend.data._M_elems[4] = 0;
  minrandom.m_backend.data._M_elems[5] = 0;
  minrandom.m_backend.data._M_elems[6] = 0;
  minrandom.m_backend.data._M_elems[7] = 0;
  minrandom.m_backend.data._M_elems[8] = 0;
  minrandom.m_backend.data._M_elems[9] = 0;
  minrandom.m_backend.data._M_elems[10] = 0;
  minrandom.m_backend.data._M_elems[0xb] = 0;
  minrandom.m_backend.data._M_elems[0xc] = 0;
  minrandom.m_backend.data._M_elems[0xd] = 0;
  minrandom.m_backend.data._M_elems[0xe] = 0;
  minrandom.m_backend.data._M_elems[0xf] = 0;
  minrandom.m_backend.data._M_elems[0x10] = 0;
  minrandom.m_backend.data._M_elems[0x11] = 0;
  minrandom.m_backend.data._M_elems[0x12] = 0;
  minrandom.m_backend.data._M_elems[0x13] = 0;
  minrandom.m_backend.data._M_elems[0x14] = 0;
  minrandom.m_backend.data._M_elems[0x15] = 0;
  minrandom.m_backend.data._M_elems[0x16] = 0;
  minrandom.m_backend.data._M_elems[0x17] = 0;
  minrandom.m_backend.data._M_elems[0x18] = 0;
  minrandom.m_backend.data._M_elems[0x19] = 0;
  minrandom.m_backend.data._M_elems._104_5_ = 0;
  minrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  minrandom.m_backend.exp = 0;
  minrandom.m_backend.neg = false;
  local_ef8 = this;
  local_ef0 = uvec;
  local_ee8 = p_low;
  local_ee0 = p_up;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&minrandom.m_backend,&p_delta->m_backend,(double *)&maxrandom);
  local_db8.data._M_elems[0] = 0;
  local_db8.data._M_elems[1] = 0x40590000;
  maxrandom.m_backend.fpclass = cpp_dec_float_finite;
  maxrandom.m_backend.prec_elem = 0x1c;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0;
  maxrandom.m_backend.data._M_elems[2] = 0;
  maxrandom.m_backend.data._M_elems[3] = 0;
  maxrandom.m_backend.data._M_elems[4] = 0;
  maxrandom.m_backend.data._M_elems[5] = 0;
  maxrandom.m_backend.data._M_elems[6] = 0;
  maxrandom.m_backend.data._M_elems[7] = 0;
  maxrandom.m_backend.data._M_elems[8] = 0;
  maxrandom.m_backend.data._M_elems[9] = 0;
  maxrandom.m_backend.data._M_elems[10] = 0;
  maxrandom.m_backend.data._M_elems[0xb] = 0;
  maxrandom.m_backend.data._M_elems[0xc] = 0;
  maxrandom.m_backend.data._M_elems[0xd] = 0;
  maxrandom.m_backend.data._M_elems[0xe] = 0;
  maxrandom.m_backend.data._M_elems[0xf] = 0;
  maxrandom.m_backend.data._M_elems[0x10] = 0;
  maxrandom.m_backend.data._M_elems[0x11] = 0;
  maxrandom.m_backend.data._M_elems[0x12] = 0;
  maxrandom.m_backend.data._M_elems[0x13] = 0;
  maxrandom.m_backend.data._M_elems[0x14] = 0;
  maxrandom.m_backend.data._M_elems[0x15] = 0;
  maxrandom.m_backend.data._M_elems[0x16] = 0;
  maxrandom.m_backend.data._M_elems[0x17] = 0;
  maxrandom.m_backend.data._M_elems[0x18] = 0;
  maxrandom.m_backend.data._M_elems[0x19] = 0;
  maxrandom.m_backend.data._M_elems._104_5_ = 0;
  maxrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  maxrandom.m_backend.exp = 0;
  maxrandom.m_backend.neg = false;
  local_f08 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)p_delta;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&maxrandom.m_backend,&p_delta->m_backend,(double *)&local_db8);
  pSVar7 = local_ef8;
  local_db8.fpclass = cpp_dec_float_finite;
  local_db8.prec_elem = 0x1c;
  local_db8.data._M_elems[0] = 0;
  local_db8.data._M_elems[1] = 0;
  local_db8.data._M_elems[2] = 0;
  local_db8.data._M_elems[3] = 0;
  local_db8.data._M_elems[4] = 0;
  local_db8.data._M_elems[5] = 0;
  local_db8.data._M_elems[6] = 0;
  local_db8.data._M_elems[7] = 0;
  local_db8.data._M_elems[8] = 0;
  local_db8.data._M_elems[9] = 0;
  local_db8.data._M_elems[10] = 0;
  local_db8.data._M_elems[0xb] = 0;
  local_db8.data._M_elems[0xc] = 0;
  local_db8.data._M_elems[0xd] = 0;
  local_db8.data._M_elems[0xe] = 0;
  local_db8.data._M_elems[0xf] = 0;
  local_db8.data._M_elems[0x10] = 0;
  local_db8.data._M_elems[0x11] = 0;
  local_db8.data._M_elems[0x12] = 0;
  local_db8.data._M_elems[0x13] = 0;
  local_db8.data._M_elems[0x14] = 0;
  local_db8.data._M_elems[0x15] = 0;
  local_db8.data._M_elems[0x16] = 0;
  local_db8.data._M_elems[0x17] = 0;
  local_db8.data._M_elems[0x18] = 0;
  local_db8.data._M_elems[0x19] = 0;
  local_db8.data._M_elems._104_5_ = 0;
  local_db8.data._M_elems[0x1b]._1_3_ = 0;
  local_db8.exp = 0;
  local_db8.neg = false;
  local_eb8.fpclass = cpp_dec_float_finite;
  local_eb8.prec_elem = 0x1c;
  local_eb8.data._M_elems[0] = 0;
  local_eb8.data._M_elems[1] = 0;
  local_eb8.data._M_elems[2] = 0;
  local_eb8.data._M_elems[3] = 0;
  local_eb8.data._M_elems[4] = 0;
  local_eb8.data._M_elems[5] = 0;
  local_eb8.data._M_elems[6] = 0;
  local_eb8.data._M_elems[7] = 0;
  local_eb8.data._M_elems[8] = 0;
  local_eb8.data._M_elems[9] = 0;
  local_eb8.data._M_elems[10] = 0;
  local_eb8.data._M_elems[0xb] = 0;
  local_eb8.data._M_elems[0xc] = 0;
  local_eb8.data._M_elems[0xd] = 0;
  local_eb8.data._M_elems[0xe] = 0;
  local_eb8.data._M_elems[0xf] = 0;
  local_eb8.data._M_elems[0x10] = 0;
  local_eb8.data._M_elems[0x11] = 0;
  local_eb8.data._M_elems[0x12] = 0;
  local_eb8.data._M_elems[0x13] = 0;
  local_eb8.data._M_elems[0x14] = 0;
  local_eb8.data._M_elems[0x15] = 0;
  local_eb8.data._M_elems[0x16] = 0;
  local_eb8.data._M_elems[0x17] = 0;
  local_eb8.data._M_elems[0x18] = 0;
  local_eb8.data._M_elems[0x19] = 0;
  local_eb8.data._M_elems._104_5_ = 0;
  local_eb8.data._M_elems[0x1b]._1_3_ = 0;
  local_eb8.exp = 0;
  local_eb8.neg = false;
  local_e38.fpclass = cpp_dec_float_finite;
  local_e38.prec_elem = 0x1c;
  local_e38.data._M_elems[0] = 0;
  local_e38.data._M_elems[1] = 0;
  local_e38.data._M_elems[2] = 0;
  local_e38.data._M_elems[3] = 0;
  local_e38.data._M_elems[4] = 0;
  local_e38.data._M_elems[5] = 0;
  local_e38.data._M_elems[6] = 0;
  local_e38.data._M_elems[7] = 0;
  local_e38.data._M_elems[8] = 0;
  local_e38.data._M_elems[9] = 0;
  local_e38.data._M_elems[10] = 0;
  local_e38.data._M_elems[0xb] = 0;
  local_e38.data._M_elems[0xc] = 0;
  local_e38.data._M_elems[0xd] = 0;
  local_e38.data._M_elems[0xe] = 0;
  local_e38.data._M_elems[0xf] = 0;
  local_e38.data._M_elems[0x18] = 0;
  local_e38.data._M_elems[0x19] = 0;
  local_e38.data._M_elems._104_5_ = 0;
  local_e38.data._M_elems[0x1b]._1_3_ = 0;
  local_e38.exp = 0;
  local_e38.neg = false;
  local_e38.data._M_elems[0x10] = 0;
  local_e38.data._M_elems[0x11] = 0;
  local_e38.data._M_elems[0x12] = 0;
  local_e38.data._M_elems[0x13] = 0;
  local_e38.data._M_elems[0x14] = 0;
  local_e38.data._M_elems[0x15] = 0;
  local_e38.data._M_elems[0x16] = 0;
  local_e38.data._M_elems[0x17] = 0;
  if (local_ef8->fullPerturbation == true) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&eps->m_backend,(cpp_dec_float<200U,_int,_void> *)local_f08);
    local_f08 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&pSVar7->random;
    local_ef8 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&pSVar7->theShift;
    lVar4 = 0x1c;
    uVar19 = ~start + (int)((ulong)((long)(local_ef0->
                                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_ef0->
                                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 7);
    while (-1 < (int)uVar19) {
      local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(local_ef0._4_4_,uVar19);
      pnVar14 = (local_ee0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = pnVar14 + uVar19;
      pcVar16 = &local_e38;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      iVar1 = pnVar14[uVar19].m_backend.exp;
      local_e38.exp = iVar1;
      bVar8 = pnVar14[uVar19].m_backend.neg;
      local_e38.neg = bVar8;
      fVar2 = pnVar14[uVar19].m_backend.fpclass;
      iVar3 = pnVar14[uVar19].m_backend.prec_elem;
      local_e38.prec_elem = iVar3;
      local_e38.fpclass = fVar2;
      pnVar14 = (local_ee8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = pnVar14 + uVar19;
      pcVar16 = &local_eb8;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_eb8.exp = pnVar14[uVar19].m_backend.exp;
      local_eb8.neg = pnVar14[uVar19].m_backend.neg;
      local_eb8.fpclass = pnVar14[uVar19].m_backend.fpclass;
      local_eb8.prec_elem = pnVar14[uVar19].m_backend.prec_elem;
      pnVar14 = local_ed0 + uVar19;
      pcVar16 = &local_db8;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = *(uint *)&pnVar14->m_backend;
        pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_db8.exp = *(int *)((long)(local_ed0 + uVar19) + 0x70);
      local_db8.neg = *(bool *)((long)(local_ed0 + uVar19) + 0x74);
      local_db8._120_8_ = *(undefined8 *)((long)(local_ed0 + uVar19) + 0x78);
      pcVar16 = &local_e38;
      pnVar17 = &local_b30;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_b30.m_backend.exp = iVar1;
      local_b30.m_backend.neg = bVar8;
      local_b30.m_backend.fpclass = fVar2;
      local_b30.m_backend.prec_elem = iVar3;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_b0,*pdVar11,(type *)0x0);
      pnVar17 = eps;
      pnVar18 = &local_2b0;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = (eps->m_backend).exp;
      local_2b0.m_backend.neg = (eps->m_backend).neg;
      local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
      local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_b30,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_b0,&local_2b0);
      if (bVar8) {
        pcVar16 = &local_eb8;
        pnVar17 = &local_330;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_330.m_backend.exp = local_eb8.exp;
        local_330.m_backend.neg = local_eb8.neg;
        local_330.m_backend.fpclass = local_eb8.fpclass;
        local_330.m_backend.prec_elem = local_eb8.prec_elem;
        pcVar16 = &local_e38;
        pnVar17 = &local_3b0;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4)
          ;
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_3b0.m_backend.exp = local_e38.exp;
        local_3b0.m_backend.neg = local_e38.neg;
        local_3b0.m_backend.fpclass = local_e38.fpclass;
        local_3b0.m_backend.prec_elem = local_e38.prec_elem;
        pnVar17 = eps;
        pnVar18 = &local_430;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = (eps->m_backend).exp;
        local_430.m_backend.neg = (eps->m_backend).neg;
        local_430.m_backend.fpclass = (eps->m_backend).fpclass;
        local_430.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_330,&local_3b0,&local_430);
        if (bVar8) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&local_db8,&eps->m_backend);
          tVar9 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e38,&result_1);
          if (tVar9) {
            dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_f10 = Random::next((Random *)local_f08,dVar5,dVar6);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result_1.m_backend,&local_db8,&local_f10);
            pnVar14 = (local_ee0->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar17 = &result_1;
            pnVar13 = pnVar14 + uVar19;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = *(undefined4 *)pnVar17;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            pnVar14[uVar19].m_backend.exp = result_1.m_backend.exp;
            pnVar14[uVar19].m_backend.neg = result_1.m_backend.neg;
            pnVar14[uVar19].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar14[uVar19].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,
                       &(local_ee0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar19].m_backend,&local_e38);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_ef8,&result_1.m_backend);
          }
        }
      }
      pcVar16 = &local_eb8;
      pnVar17 = &local_4b0;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_4b0.m_backend.exp = local_eb8.exp;
      local_4b0.m_backend.neg = local_eb8.neg;
      local_4b0.m_backend.fpclass = local_eb8.fpclass;
      local_4b0.m_backend.prec_elem = local_eb8.prec_elem;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_130,-*pdVar11,(type *)0x0);
      pnVar17 = eps;
      pnVar18 = &local_530;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_530.m_backend.exp = (eps->m_backend).exp;
      local_530.m_backend.neg = (eps->m_backend).neg;
      local_530.m_backend.fpclass = (eps->m_backend).fpclass;
      local_530.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_4b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_130,&local_530);
      iVar1 = (int)local_ef0;
      if (bVar8) {
        pcVar16 = &local_eb8;
        pnVar17 = &local_5b0;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_5b0.m_backend.exp = local_eb8.exp;
        local_5b0.m_backend.neg = local_eb8.neg;
        local_5b0.m_backend.fpclass = local_eb8.fpclass;
        local_5b0.m_backend.prec_elem = local_eb8.prec_elem;
        pcVar16 = &local_e38;
        pnVar17 = &local_630;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4)
          ;
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_630.m_backend.exp = local_e38.exp;
        local_630.m_backend.neg = local_e38.neg;
        local_630.m_backend.fpclass = local_e38.fpclass;
        local_630.m_backend.prec_elem = local_e38.prec_elem;
        pnVar17 = eps;
        pnVar18 = &local_6b0;
        for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_6b0.m_backend.exp = (eps->m_backend).exp;
        local_6b0.m_backend.neg = (eps->m_backend).neg;
        local_6b0.m_backend.fpclass = (eps->m_backend).fpclass;
        local_6b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_5b0,&local_630,&local_6b0);
        if (bVar8) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&local_db8,&eps->m_backend);
          tVar9 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_eb8,&result_1);
          if (tVar9) {
            dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_f10 = Random::next((Random *)local_f08,dVar5,dVar6);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result_1.m_backend,&local_db8,&local_f10);
            pnVar14 = (local_ee8->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar17 = &result_1;
            pnVar13 = pnVar14 + uVar19;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = *(undefined4 *)pnVar17;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            pnVar14[uVar19].m_backend.exp = result_1.m_backend.exp;
            pnVar14[uVar19].m_backend.neg = result_1.m_backend.neg;
            pnVar14[uVar19].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar14[uVar19].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,
                       &(local_ee8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar19].m_backend,&local_eb8);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_ef8,&result_1.m_backend);
          }
        }
      }
      uVar19 = iVar1 - incr;
    }
  }
  else {
    pnVar14 = (local_ef0->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = ~start + (local_ef0->thedelta).super_IdxSet.num;
    local_f08 = &local_ef8->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_ec0 = &local_ef8->random;
    local_ec8 = &(local_ef8->theShift).m_backend;
    lVar4 = 0x1c;
    while( true ) {
      if ((int)uVar19 < 0) break;
      iVar1 = (local_ef0->thedelta).super_IdxSet.idx[uVar19];
      pnVar13 = pnVar14 + iVar1;
      pcVar16 = &local_db8;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_db8.exp = pnVar14[iVar1].m_backend.exp;
      local_db8.neg = pnVar14[iVar1].m_backend.neg;
      local_db8.fpclass = pnVar14[iVar1].m_backend.fpclass;
      local_db8.prec_elem = pnVar14[iVar1].m_backend.prec_elem;
      pnVar13 = (local_ee0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar15 = pnVar13 + iVar1;
      pcVar16 = &local_e38;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_e38.exp = pnVar13[iVar1].m_backend.exp;
      local_e38.neg = pnVar13[iVar1].m_backend.neg;
      local_e38.fpclass = pnVar13[iVar1].m_backend.fpclass;
      local_e38.prec_elem = pnVar13[iVar1].m_backend.prec_elem;
      pnVar13 = (local_ee8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar15 = pnVar13 + iVar1;
      pcVar16 = &local_eb8;
      for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
      }
      local_eb8.exp = pnVar13[iVar1].m_backend.exp;
      local_eb8.neg = pnVar13[iVar1].m_backend.neg;
      local_eb8.fpclass = pnVar13[iVar1].m_backend.fpclass;
      local_eb8.prec_elem = pnVar13[iVar1].m_backend.prec_elem;
      SVar10 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualStatus(local_f08,
                            (local_ef8->
                            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).theBaseId.data + iVar1);
      lVar12 = lVar4;
      pnVar17 = eps;
      pnVar18 = &result_1;
      if (SVar10 != D_ON_BOTH) {
        for (; lVar12 != 0; lVar12 = lVar12 + -1) {
          *(uint *)pnVar18 = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        result_1.m_backend.exp = (eps->m_backend).exp;
        result_1.m_backend.neg = (eps->m_backend).neg;
        result_1.m_backend.fpclass = (eps->m_backend).fpclass;
        result_1.m_backend.prec_elem = (eps->m_backend).prec_elem;
        if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
            result_1.m_backend.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
        tVar9 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_db8,&result_1);
        if (tVar9) {
          pcVar16 = &local_e38;
          pnVar17 = &local_bb0;
          for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_bb0.m_backend.exp = local_e38.exp;
          local_bb0.m_backend.neg = local_e38.neg;
          local_bb0.m_backend.fpclass = local_e38.fpclass;
          local_bb0.m_backend.prec_elem = local_e38.prec_elem;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_1b0,*pdVar11,(type *)0x0);
          pnVar17 = eps;
          pnVar18 = &local_730;
          for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_730.m_backend.exp = (eps->m_backend).exp;
          local_730.m_backend.neg = (eps->m_backend).neg;
          local_730.m_backend.fpclass = (eps->m_backend).fpclass;
          local_730.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_bb0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b0,&local_730);
          if (bVar8) {
            pcVar16 = &local_eb8;
            pnVar17 = &local_7b0;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            local_7b0.m_backend.exp = local_eb8.exp;
            local_7b0.m_backend.neg = local_eb8.neg;
            local_7b0.m_backend.fpclass = local_eb8.fpclass;
            local_7b0.m_backend.prec_elem = local_eb8.prec_elem;
            pcVar16 = &local_e38;
            pnVar17 = &local_830;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            local_830.m_backend.exp = local_e38.exp;
            local_830.m_backend.neg = local_e38.neg;
            local_830.m_backend.fpclass = local_e38.fpclass;
            local_830.m_backend.prec_elem = local_e38.prec_elem;
            pnVar17 = eps;
            pnVar18 = &local_8b0;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            local_8b0.m_backend.exp = (eps->m_backend).exp;
            local_8b0.m_backend.neg = (eps->m_backend).neg;
            local_8b0.m_backend.fpclass = (eps->m_backend).fpclass;
            local_8b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_7b0,&local_830,&local_8b0);
            if (bVar8) {
              local_f00 = &local_ed0[iVar1].m_backend;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1.m_backend,&local_e38,&eps->m_backend);
              tVar9 = boost::multiprecision::operator>=
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_f00,&result_1);
              if (tVar9) {
                local_ed8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            extract_double(&minrandom.m_backend);
                dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        extract_double(&maxrandom.m_backend);
                local_f10 = Random::next(local_ec0,local_ed8,dVar5);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                          (&result_1.m_backend,local_f00,&local_f10);
                pnVar13 = (local_ee0->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar17 = &result_1;
                pnVar15 = pnVar13 + iVar1;
                for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar15->m_backend).data._M_elems[0] = *(undefined4 *)pnVar17;
                  pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
                  pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
                }
                pnVar13[iVar1].m_backend.exp = result_1.m_backend.exp;
                pnVar13[iVar1].m_backend.neg = result_1.m_backend.neg;
                pnVar13[iVar1].m_backend.fpclass = result_1.m_backend.fpclass;
                pnVar13[iVar1].m_backend.prec_elem = result_1.m_backend.prec_elem;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,
                           &(local_ee0->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&local_e38);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (local_ec8,&result_1.m_backend);
              }
            }
          }
        }
        else {
          tVar9 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_db8,eps);
          if (tVar9) {
            pcVar16 = &local_eb8;
            pnVar17 = &local_c30;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            local_c30.m_backend.exp = local_eb8.exp;
            local_c30.m_backend.neg = local_eb8.neg;
            local_c30.m_backend.fpclass = local_eb8.fpclass;
            local_c30.m_backend.prec_elem = local_eb8.prec_elem;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&local_230,-*pdVar11,(type *)0x0);
            pnVar17 = eps;
            pnVar18 = &local_930;
            for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            local_930.m_backend.exp = (eps->m_backend).exp;
            local_930.m_backend.neg = (eps->m_backend).neg;
            local_930.m_backend.fpclass = (eps->m_backend).fpclass;
            local_930.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_c30,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_230,&local_930);
            if (bVar8) {
              pcVar16 = &local_eb8;
              pnVar17 = &local_9b0;
              for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              }
              local_9b0.m_backend.exp = local_eb8.exp;
              local_9b0.m_backend.neg = local_eb8.neg;
              local_9b0.m_backend.fpclass = local_eb8.fpclass;
              local_9b0.m_backend.prec_elem = local_eb8.prec_elem;
              pcVar16 = &local_e38;
              pnVar17 = &local_a30;
              for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
              }
              local_a30.m_backend.exp = local_e38.exp;
              local_a30.m_backend.neg = local_e38.neg;
              local_a30.m_backend.fpclass = local_e38.fpclass;
              local_a30.m_backend.prec_elem = local_e38.prec_elem;
              pnVar17 = eps;
              pnVar18 = &local_ab0;
              for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
              }
              local_ab0.m_backend.exp = (eps->m_backend).exp;
              local_ab0.m_backend.neg = (eps->m_backend).neg;
              local_ab0.m_backend.fpclass = (eps->m_backend).fpclass;
              local_ab0.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_9b0,&local_a30,&local_ab0);
              if (bVar8) {
                local_f00 = &local_ed0[iVar1].m_backend;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,&local_eb8,&eps->m_backend);
                tVar9 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_f00,&result_1);
                if (tVar9) {
                  local_ed8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              extract_double(&minrandom.m_backend);
                  dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          extract_double(&maxrandom.m_backend);
                  local_f10 = Random::next(local_ec0,local_ed8,dVar5);
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                            (&result_1.m_backend,local_f00,&local_f10);
                  pnVar13 = (local_ee8->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pnVar17 = &result_1;
                  pnVar15 = pnVar13 + iVar1;
                  for (lVar12 = lVar4; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pnVar15->m_backend).data._M_elems[0] = *(undefined4 *)pnVar17;
                    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
                    pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
                  }
                  pnVar13[iVar1].m_backend.exp = result_1.m_backend.exp;
                  pnVar13[iVar1].m_backend.neg = result_1.m_backend.neg;
                  pnVar13[iVar1].m_backend.fpclass = result_1.m_backend.fpclass;
                  pnVar13[iVar1].m_backend.prec_elem = result_1.m_backend.prec_elem;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,
                             &(local_ee8->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&local_eb8)
                  ;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (local_ec8,&result_1.m_backend);
                }
              }
            }
          }
        }
      }
      uVar19 = uVar19 - incr;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double) minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. with computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}